

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

MIR_reg_t scan_var_to_var(gen_ctx_t gen_ctx,int scan_var)

{
  size_t sVar1;
  int scan_var_local;
  gen_ctx_t gen_ctx_local;
  
  gen_ctx_local._4_4_ = scan_var;
  if (gen_ctx->lr_ctx->scan_vars_num != 0) {
    if ((scan_var < 0) ||
       (sVar1 = VARR_MIR_reg_tlength(gen_ctx->lr_ctx->scan_var_to_var_map), (int)sVar1 <= scan_var))
    {
      __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
    }
    gen_ctx_local._4_4_ = VARR_MIR_reg_tget(gen_ctx->lr_ctx->scan_var_to_var_map,(long)scan_var);
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static MIR_reg_t scan_var_to_var (gen_ctx_t gen_ctx, int scan_var) {
  if (scan_vars_num == 0) return (MIR_reg_t) scan_var;
  gen_assert (scan_var >= 0 && (int) VARR_LENGTH (MIR_reg_t, scan_var_to_var_map) > scan_var);
  return VARR_GET (MIR_reg_t, scan_var_to_var_map, scan_var);
}